

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_geometry_device.cpp
# Opt level: O3

void embree::renderPixelStandard
               (TutorialData *data,int x,int y,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,RayStats *stats)

{
  Vec3fa *pVVar1;
  Vec3fa *pVVar2;
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar8;
  float fVar9;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar10;
  float fVar11;
  float fVar16;
  float fVar17;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar18;
  undefined1 auVar15 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float local_198;
  float fStack_194;
  undefined1 local_158 [8];
  float fStack_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  uint local_128;
  ulong local_124;
  float local_11c;
  uint local_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined4 local_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  
  fVar11 = (float)x;
  fVar19 = (float)y;
  local_148 = (camera->xfm).l.vz.field_0.field_0.x +
              fVar19 * (camera->xfm).l.vy.field_0.field_0.x +
              fVar11 * (camera->xfm).l.vx.field_0.field_0.x;
  fStack_144 = (camera->xfm).l.vz.field_0.field_0.y +
               fVar19 * (camera->xfm).l.vy.field_0.field_0.y +
               fVar11 * (camera->xfm).l.vx.field_0.field_0.y;
  fVar10 = (camera->xfm).l.vz.field_0.field_0.z +
           fVar19 * (camera->xfm).l.vy.field_0.field_0.z +
           fVar11 * (camera->xfm).l.vx.field_0.field_0.z;
  fVar11 = fVar19 * 0.0 + fVar11 * 0.0 + 0.0;
  fVar19 = fStack_144 * fStack_144;
  fVar17 = fVar10 * fVar10;
  fVar11 = fVar11 * fVar11;
  fVar20 = fVar19 + local_148 * local_148 + fVar17;
  fVar23 = fVar19 + fVar19 + fVar11;
  fVar17 = fVar19 + fVar17 + fVar17;
  fVar11 = fVar19 + fVar11 + fVar11;
  auVar12._4_4_ = fVar23;
  auVar12._0_4_ = fVar20;
  auVar12._8_4_ = fVar17;
  auVar12._12_4_ = fVar11;
  auVar13._4_4_ = fVar23;
  auVar13._0_4_ = fVar20;
  auVar13._8_4_ = fVar17;
  auVar13._12_4_ = fVar11;
  auVar13 = rsqrtss(auVar12,auVar13);
  fVar11 = auVar13._0_4_;
  fStack_140 = fVar11 * fVar11 * fVar20 * -0.5 * fVar11 + fVar11 * 1.5;
  local_148 = fStack_140 * local_148;
  fStack_144 = fStack_140 * fStack_144;
  fStack_140 = fStack_140 * fVar10;
  fStack_150 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_158 = *(undefined8 *)&(camera->xfm).p.field_0;
  register0x0000120c = 0;
  fStack_13c = 0.0;
  local_138 = 0xffffffff7f800000;
  local_114 = 0xffffffff;
  uStack_110 = 0xffffffff;
  uStack_10c = 0xffffffff;
  uStack_108 = 0xffffffff;
  local_50 = 0xe38e200000000;
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  rtcTraversableIntersect1(data->g_traversable,local_158);
  stats->numRays = stats->numRays + 1;
  local_e8 = 1.0;
  fStack_e4 = 0.0;
  fStack_e0 = 0.0;
  fStack_dc = 0.0;
  fVar10 = 0.0;
  fVar11 = 0.0;
  fVar19 = 0.0;
  switch(uStack_110) {
  case 0:
    goto switchD_0011e230_caseD_0;
  case 1:
  case 2:
  case 6:
    fVar10 = 1.0 - local_11c;
    pVVar1 = data->hair_vertex_colors + (local_114 + 1);
    pVVar2 = data->hair_vertex_colors + (local_114 + 2);
    local_e8 = local_11c * (pVVar2->field_0).m128[0] + fVar10 * (pVVar1->field_0).m128[0];
    fStack_e4 = local_11c * (pVVar2->field_0).m128[1] + fVar10 * (pVVar1->field_0).m128[1];
    fStack_e0 = local_11c * (pVVar2->field_0).m128[2] + fVar10 * (pVVar1->field_0).m128[2];
    fStack_dc = local_11c * (pVVar2->field_0).m128[3] + fVar10 * (pVVar1->field_0).m128[3];
    break;
  case 3:
  case 4:
  case 5:
    interpolate_bspline((embree *)&local_d8,data,local_114,local_11c);
    local_e8 = local_d8;
    fStack_e4 = fStack_d4;
    fStack_e0 = fStack_d0;
    fStack_dc = fStack_cc;
    break;
  case 7:
  case 8:
  case 9:
    interpolate_catmull_rom((embree *)&local_d8,data,local_114,local_11c);
    local_e8 = local_d8;
    fStack_e4 = fStack_d4;
    fStack_e0 = fStack_d0;
    fStack_dc = fStack_cc;
    break;
  case 0xffffffff:
switchD_0011e230_caseD_ffffffff:
    if (1.0 <= fVar10) {
      fVar10 = 1.0;
    }
    fVar17 = 0.0;
    if (0.0 <= fVar10) {
      fVar17 = fVar10;
    }
    if (1.0 <= fVar11) {
      fVar11 = 1.0;
    }
    fVar10 = 0.0;
    if (0.0 <= fVar11) {
      fVar10 = fVar11;
    }
    if (1.0 <= fVar19) {
      fVar19 = 1.0;
    }
    fVar11 = 0.0;
    if (0.0 <= fVar19) {
      fVar11 = fVar19;
    }
    pixels[width * y + x] =
         (int)(long)(fVar10 * 255.0) * 0x100 + (int)(long)(fVar17 * 255.0) +
         (int)(long)(fVar11 * 255.0) * 0x10000;
    return;
  }
  local_e8 = local_e8 * 0.5;
  fStack_e4 = fStack_e4 * 0.5;
  fStack_e0 = fStack_e0 * 0.5;
  fStack_dc = fStack_dc * 0.5;
switchD_0011e230_caseD_0:
  local_f8 = ZEXT416(local_128);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_124;
  auVar13 = rsqrtss(auVar6,0x40400000);
  fVar10 = auVar13._0_4_;
  fVar17 = fVar10 * 1.5 - fVar10 * fVar10 * fVar10 * 1.5;
  fVar20 = fVar17 * -1.0;
  fVar23 = fVar17 * -1.0;
  fVar17 = fVar17 * -1.0;
  fVar10 = local_e8 * 0.5 + 0.0;
  fVar11 = fStack_e4 * 0.5 + 0.0;
  fVar19 = fStack_e0 * 0.5 + 0.0;
  local_d8 = (float)local_138 * local_148 + (float)local_158._0_4_;
  fStack_d4 = (float)local_138 * fStack_144 + (float)local_158._4_4_;
  fStack_d0 = (float)local_138 * fStack_140 + fStack_150;
  local_c8 = -fVar20;
  fStack_c4 = -fVar23;
  fStack_c0 = -fVar17;
  fStack_cc = 0.001;
  uStack_bc = 0;
  local_b8 = 0xffffffff7f800000;
  local_94 = 0xffffffff;
  uStack_90 = 0xffffffff;
  uStack_8c = 0xffffffff;
  uStack_88 = 0xffffffff;
  local_70 = 0xe38e200000000;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  rtcTraversableOccluded1(data->g_traversable,&local_d8);
  stats->numRays = stats->numRays + 1;
  if (0.0 <= (float)local_b8) {
    local_198 = (float)local_124;
    fStack_194 = (float)(local_124 >> 0x20);
    fVar25 = local_f8._0_4_;
    auVar7._4_12_ = local_f8._4_12_;
    auVar7._0_4_ = fVar25 * fVar25 + local_198 * local_198 + fStack_194 * fStack_194;
    auVar14._4_4_ = local_f8._4_4_;
    auVar14._0_4_ = auVar7._0_4_;
    auVar14._8_4_ = local_f8._8_4_;
    auVar14._12_4_ = local_f8._12_4_;
    auVar13 = rsqrtss(auVar14,auVar7);
    fVar4 = auVar13._0_4_;
    fVar21 = fVar4 * 1.5 - fVar4 * fVar4 * auVar7._0_4_ * 0.5 * fVar4;
    fVar25 = fVar25 * fVar21;
    local_198 = fVar21 * local_198;
    fVar21 = fVar21 * fStack_194;
    fVar4 = fStack_140 * fVar21 + fStack_144 * local_198 + local_148 * fVar25;
    fVar4 = fVar4 + fVar4;
    fVar5 = fVar4 * fVar25 - local_148;
    fVar8 = fVar4 * local_198 - fStack_144;
    fVar9 = fVar4 * fVar21 - fStack_140;
    fVar4 = fVar4 * 0.0 - fStack_13c;
    fVar16 = fVar8 * fVar8;
    fVar18 = fVar9 * fVar9;
    fVar4 = fVar4 * fVar4;
    fVar22 = fVar16 + fVar5 * fVar5 + fVar18;
    fVar24 = fVar16 + fVar16 + fVar4;
    fVar18 = fVar16 + fVar18 + fVar18;
    fVar4 = fVar16 + fVar4 + fVar4;
    auVar15._4_4_ = fVar24;
    auVar15._0_4_ = fVar22;
    auVar15._8_4_ = fVar18;
    auVar15._12_4_ = fVar4;
    auVar3._4_4_ = fVar24;
    auVar3._0_4_ = fVar22;
    auVar3._8_4_ = fVar18;
    auVar3._12_4_ = fVar4;
    auVar13 = rsqrtss(auVar15,auVar3);
    fVar4 = auVar13._0_4_;
    fVar4 = fVar4 * 1.5 - fVar4 * fVar4 * fVar22 * 0.5 * fVar4;
    fVar4 = fVar4 * fVar9 * fVar17 + fVar4 * fVar8 * fVar23 + fVar4 * fVar5 * fVar20;
    if (1.0 <= fVar4) {
      fVar4 = 1.0;
    }
    fVar5 = 0.0;
    if (0.0 <= fVar4) {
      fVar5 = fVar4;
    }
    fVar4 = powf(fVar5,10.0);
    fVar17 = -(fVar21 * fVar17 + local_198 * fVar23 + fVar25 * fVar20);
    if (1.0 <= fVar17) {
      fVar17 = 1.0;
    }
    fVar20 = 0.0;
    if (0.0 <= fVar17) {
      fVar20 = fVar17;
    }
    fVar4 = fVar4 * 0.5;
    fVar10 = fVar10 + local_e8 * fVar20 + fVar4;
    fVar11 = fVar11 + fStack_e4 * fVar20 + fVar4;
    fVar19 = fVar19 + fStack_e0 * fVar20 + fVar4;
  }
  goto switchD_0011e230_caseD_ffffffff;
}

Assistant:

void renderPixelStandard(const TutorialData& data,
                         int x, int y, 
                         int* pixels,
                         const unsigned int width,
                         const unsigned int height,
                         const float time,
                         const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  /* intersect ray with scene */
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
  iargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
  rtcTraversableIntersect1(data.g_traversable,RTCRayHit_(ray),&iargs);
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    /* interpolate diffuse color */
    Vec3fa diffuse = Vec3fa(1.0f,0.0f,0.0f);
    if (ray.geomID > 0)
    {
      switch (ray.geomID) {
      case 1: case 2: case 6: diffuse = interpolate_linear(data,ray.primID,ray.u); break;
      case 3: case 4: case 5: diffuse = interpolate_bspline(data,ray.primID,ray.u); break;
      case 7: case 8: case 9: diffuse = interpolate_catmull_rom(data,ray.primID,ray.u); break;
      }

      diffuse = 0.5f*diffuse;
    }

    /* calculate smooth shading normal */
    Vec3fa Ng = normalize(ray.Ng);
    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf, 0.0f);

    /* trace shadow ray */
    RTCOccludedArguments sargs;
    rtcInitOccludedArguments(&sargs);
    sargs.feature_mask = (RTCFeatureFlags) (FEATURE_MASK);
    rtcTraversableOccluded1(data.g_traversable,RTCRay_(shadow),&sargs);
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f) {
      Vec3fa r = normalize(reflect(ray.dir,Ng));
      float s = pow(clamp(dot(r,lightDir),0.0f,1.0f),10.0f);
      float d = clamp(-dot(lightDir,Ng),0.0f,1.0f);
      color = color + diffuse*d + 0.5f*Vec3fa(s);
    }
  }

  /* write color to framebuffer */
  unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
  unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
  unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
  pixels[y*width+x] = (b << 16) + (g << 8) + r;
}